

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_node4_t * art_node4_create(art_t *art,art_key_chunk_t *prefix,uint8_t prefix_size)

{
  art_inner_node_t *node_00;
  art_node4_t *prefix_00;
  undefined1 in_DL;
  long in_RDI;
  art_node4_t *node;
  uint64_t index;
  undefined8 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  node_00 = (art_inner_node_t *)
            art_allocate_index((art_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
                               (art_typecode_t)((ulong)in_stack_ffffffffffffffe0 >> 0x38));
  prefix_00 = (art_node4_t *)(*(long *)(in_RDI + 0x78) + (long)node_00 * 0x30);
  art_init_inner_node(node_00,(art_key_chunk_t *)prefix_00,'\0');
  (prefix_00->field_0).field_0.count = '\0';
  return prefix_00;
}

Assistant:

static art_node4_t *art_node4_create(art_t *art, const art_key_chunk_t prefix[],
                                     uint8_t prefix_size) {
    uint64_t index = art_allocate_index(art, CROARING_ART_NODE4_TYPE);
    art_node4_t *node =
        ((art_node4_t *)art->nodes[CROARING_ART_NODE4_TYPE]) + index;
    art_init_inner_node(&node->base, prefix, prefix_size);
    node->count = 0;
    return node;
}